

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

int xmlCatalogConvert(void)

{
  int iVar1;
  int res;
  
  if (xmlCatalogInitialized == 0) {
    xmlInitializeCatalog();
  }
  xmlRMutexLock(xmlCatalogMutex);
  iVar1 = xmlConvertSGMLCatalog(xmlDefaultCatalog);
  xmlRMutexUnlock(xmlCatalogMutex);
  return iVar1;
}

Assistant:

int
xmlCatalogConvert(void) {
    int res = -1;

    if (!xmlCatalogInitialized)
	xmlInitializeCatalog();

    xmlRMutexLock(xmlCatalogMutex);
    res = xmlConvertSGMLCatalog(xmlDefaultCatalog);
    xmlRMutexUnlock(xmlCatalogMutex);
    return(res);
}